

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O1

string * __thiscall
SchemeCompoundProcedure::external_repr_abi_cxx11_
          (string *__return_storage_ptr__,SchemeCompoundProcedure *this)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long *local_30;
  long local_28;
  long local_20;
  long lStack_18;
  
  if ((this->super_SchemeProcedure).name._M_string_length == 0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50);
  }
  else {
    std::operator+(&local_50," ",&(this->super_SchemeProcedure).name);
  }
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x15a725);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_20 = *plVar3;
    lStack_18 = plVar2[3];
    local_30 = &local_20;
  }
  else {
    local_20 = *plVar3;
    local_30 = (long *)*plVar2;
  }
  local_28 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_30);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_30 != &local_20) {
    operator_delete(local_30,local_20 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SchemeCompoundProcedure::external_repr() const
{
    return "<compound-procedure" + (name.empty() ? "" : (" " + name)) + ">";
}